

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Help_View.cxx
# Opt level: O0

void __thiscall Fl_Help_View::topline(Fl_Help_View *this,int top)

{
  int iVar1;
  int iVar2;
  int local_24;
  int local_14;
  int scrollsize;
  int top_local;
  Fl_Help_View *this_local;
  
  if (this->value_ != (char *)0x0) {
    if (this->scrollbar_size_ == 0) {
      local_24 = Fl::scrollbar_size();
    }
    else {
      local_24 = this->scrollbar_size_;
    }
    iVar1 = this->size_;
    iVar2 = Fl_Widget::h((Fl_Widget *)this);
    if ((iVar1 < iVar2 - local_24) || (top < 0)) {
      local_14 = 0;
    }
    else {
      local_14 = top;
      if (this->size_ < top) {
        local_14 = this->size_;
      }
    }
    this->topline_ = local_14;
    iVar1 = this->topline_;
    iVar2 = Fl_Widget::h((Fl_Widget *)this);
    Fl_Scrollbar::value(&this->scrollbar_,iVar1,iVar2 - local_24,0,this->size_);
    Fl_Widget::do_callback((Fl_Widget *)this);
    Fl_Widget::redraw((Fl_Widget *)this);
  }
  return;
}

Assistant:

void
Fl_Help_View::topline(int top)	// I - Top line number
{
  if (!value_)
    return;

  int scrollsize = scrollbar_size_ ? scrollbar_size_ : Fl::scrollbar_size();
  if (size_ < (h() - scrollsize) || top < 0)
    top = 0;
  else if (top > size_)
    top = size_;

  topline_ = top;

  scrollbar_.value(topline_, h() - scrollsize, 0, size_);

  do_callback();

  redraw();
}